

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_greedy_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *pInLimit;
  BYTE *pBVar1;
  undefined8 *puVar2;
  U32 UVar3;
  U32 *pUVar4;
  BYTE *pBVar5;
  seqDef *psVar6;
  undefined8 uVar7;
  U32 lowestValid;
  uint uVar8;
  size_t sVar9;
  long lVar10;
  int iVar11;
  int *ip;
  int *iend;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ZSTD_matchState_t *ms_00;
  ulong uVar16;
  uint local_bc;
  size_t offbaseFound;
  uint local_ac;
  BYTE *local_a8;
  uint local_9c;
  int local_98;
  uint local_94;
  ulong local_90;
  ulong local_88;
  int *local_80;
  int *local_78;
  ulong local_70;
  int *local_68;
  uint local_5c;
  uint local_58;
  uint local_54;
  ZSTD_matchState_t *local_50;
  size_t local_48;
  BYTE *local_40;
  U32 *local_38;
  
  local_a8 = (ms->window).base;
  uVar14 = (ms->window).dictLimit;
  local_40 = local_a8 + uVar14;
  uVar12 = (ms->cParams).minMatch;
  if (5 < uVar12) {
    uVar12 = 6;
  }
  if (uVar12 < 5) {
    uVar12 = 4;
  }
  local_ac = (ms->cParams).searchLog;
  local_94 = 6;
  if (local_ac < 6) {
    local_94 = local_ac;
  }
  if (local_94 < 5) {
    local_94 = 4;
  }
  local_78 = (int *)((ulong)((int)src == (int)local_40) + (long)src);
  uVar13 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  iVar11 = (int)local_78 - (int)local_a8;
  local_58 = *rep;
  local_54 = iVar11 - uVar13;
  if (iVar11 - uVar14 <= uVar13) {
    local_54 = uVar14;
  }
  uVar13 = 0;
  if (ms->loadedDictEnd != 0) {
    local_54 = uVar14;
  }
  local_5c = rep[1];
  local_54 = iVar11 - local_54;
  local_bc = local_5c;
  if (local_54 < local_5c) {
    local_bc = uVar13;
  }
  local_9c = local_58;
  if (local_54 < local_58) {
    local_9c = uVar13;
  }
  ms->lazySkipping = 0;
  local_68 = (int *)((long)src + (srcSize - 0x10));
  uVar16 = (ulong)ms->nextToUpdate;
  uVar14 = ((int)local_68 - (int)(local_a8 + uVar16)) + 1;
  if (7 < uVar14) {
    uVar14 = 8;
  }
  if (local_68 < local_a8 + uVar16) {
    uVar14 = uVar13;
  }
  pInLimit = (int *)((long)src + srcSize);
  local_90 = (ulong)(uVar14 + ms->nextToUpdate);
  UVar3 = ms->rowHashLog;
  local_88 = (ulong)(0x38 - UVar3);
  local_98 = 0x18 - UVar3;
  local_48 = 1L << ((byte)local_94 & 0x3f);
  local_80 = (int *)CONCAT44(local_80._4_4_,UVar3 + 8);
  pUVar4 = ms->hashTable;
  pBVar5 = ms->tagTable;
  local_50 = ms;
  local_38 = rep;
  for (; uVar16 < local_90; uVar16 = uVar16 + 1) {
    if (0x20 < (uint)local_80) {
LAB_001c624a:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x353,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    if (uVar12 == 5) {
      uVar15 = *(long *)(local_a8 + uVar16) * -0x30e4432345000000;
LAB_001c5b5b:
      uVar15 = (uVar15 ^ local_50->hashSalt) >> ((byte)local_88 & 0x3f);
    }
    else {
      if (uVar12 == 6) {
        uVar15 = *(long *)(local_a8 + uVar16) * -0x30e4432340650000;
        goto LAB_001c5b5b;
      }
      uVar15 = (ulong)((*(int *)(local_a8 + uVar16) * -0x61c8864f ^ (uint)local_50->hashSalt) >>
                      ((byte)local_98 & 0x1f));
    }
    uVar14 = ((uint)(uVar15 >> 8) & 0xffffff) << ((byte)local_94 & 0x1f);
    if (((ulong)(pUVar4 + uVar14) & 0x3f) != 0) {
LAB_001c6269:
      __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                    ,0x32e,"void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)"
                   );
    }
    iVar11 = ZSTD_isAligned(pBVar5 + uVar14,local_48);
    if (iVar11 == 0) {
LAB_001c6288:
      __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                    ,0x32f,"void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)"
                   );
    }
    local_50->hashCache[(uint)uVar16 & 7] = (U32)uVar15;
  }
  local_80 = pInLimit + -8;
  ip = local_78;
  ms_00 = local_50;
  uVar14 = local_9c;
  do {
    uVar13 = local_94;
    local_90 = -(ulong)uVar14;
    while( true ) {
      if (local_68 <= ip) {
        if (local_5c <= local_54) {
          local_5c = 0;
        }
        uVar12 = local_5c;
        if (uVar14 != 0) {
          uVar12 = local_58;
        }
        if (local_58 <= local_54) {
          uVar12 = local_5c;
          local_58 = 0;
        }
        if (uVar14 != 0) {
          local_58 = uVar14;
        }
        if (local_bc != 0) {
          uVar12 = local_bc;
        }
        *local_38 = local_58;
        local_38[1] = uVar12;
        return (long)pInLimit - (long)src;
      }
      uVar8 = uVar14;
      if ((uVar14 != 0) && (*(int *)((long)ip + local_90 + 1) == *(int *)((long)ip + 1))) {
        iend = (int *)((long)ip + 1);
        sVar9 = ZSTD_count((BYTE *)((long)ip + 5),(BYTE *)((long)ip + local_90 + 5),(BYTE *)pInLimit
                          );
        uVar16 = sVar9 + 4;
        sVar9 = 1;
        goto LAB_001c5dcb;
      }
      offbaseFound = 999999999;
      if (uVar12 == 6) {
        if (uVar13 == 6) {
          uVar16 = ZSTD_RowFindBestMatch_noDict_6_6(ms_00,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound)
          ;
        }
        else if (uVar13 == 5) {
          uVar16 = ZSTD_RowFindBestMatch_noDict_6_5(ms_00,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound)
          ;
        }
        else {
          uVar16 = ZSTD_RowFindBestMatch_noDict_6_4(ms_00,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound)
          ;
        }
      }
      else if (uVar12 == 5) {
        if (uVar13 == 6) {
          uVar16 = ZSTD_RowFindBestMatch_noDict_5_6(ms_00,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound)
          ;
        }
        else if (uVar13 == 5) {
          uVar16 = ZSTD_RowFindBestMatch_noDict_5_5(ms_00,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound)
          ;
        }
        else {
          uVar16 = ZSTD_RowFindBestMatch_noDict_5_4(ms_00,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound)
          ;
        }
      }
      else if (uVar13 == 6) {
        uVar16 = ZSTD_RowFindBestMatch_noDict_4_6(ms_00,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
      }
      else if (uVar13 == 5) {
        uVar16 = ZSTD_RowFindBestMatch_noDict_4_5(ms_00,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
      }
      else {
        uVar16 = ZSTD_RowFindBestMatch_noDict_4_4(ms_00,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
      }
      if (3 < uVar16) break;
      uVar16 = (long)ip - (long)src;
      ip = (int *)((long)ip + (uVar16 >> 8) + 1);
      ms_00->lazySkipping = (uint)(0x7ff < uVar16);
    }
    iend = ip;
    sVar9 = offbaseFound;
    if (3 < offbaseFound) {
      for (; ((src < ip && (local_40 < (BYTE *)((long)ip + (3 - offbaseFound)))) &&
             (*(char *)((long)ip + -1) == *(char *)((long)ip + (2 - offbaseFound))));
          ip = (int *)((long)ip + -1)) {
        uVar16 = uVar16 + 1;
      }
      iend = ip;
      uVar8 = (int)offbaseFound - 3;
      local_bc = uVar14;
    }
LAB_001c5dcb:
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_001c6323:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < seqStore->maxNbLit) {
LAB_001c62a7:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar15 = (long)iend - (long)src;
    pBVar5 = seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < pBVar5 + uVar15) {
LAB_001c6304:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a0,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (pInLimit < iend) {
LAB_001c62c6:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a1,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    local_70 = uVar16;
    if (local_80 < iend) {
      ZSTD_safecopyLiterals(pBVar5,(BYTE *)src,(BYTE *)iend,(BYTE *)local_80);
LAB_001c5e3e:
      seqStore->lit = seqStore->lit + uVar15;
      if (0xffff < uVar15) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2b2,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      uVar7 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar5 = *src;
      *(undefined8 *)(pBVar5 + 8) = uVar7;
      pBVar5 = seqStore->lit;
      if (0x10 < uVar15) {
        if ((BYTE *)0xffffffffffffffe0 < pBVar5 + 0x10 + (-0x10 - ((long)src + 0x10))) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                        ,0xe9,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar7 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar5 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar5 + 0x18) = uVar7;
        if (0x20 < (long)uVar15) {
          lVar10 = 0;
          do {
            puVar2 = (undefined8 *)((long)src + lVar10 + 0x20);
            uVar7 = puVar2[1];
            pBVar1 = pBVar5 + lVar10 + 0x20;
            *(undefined8 *)pBVar1 = *puVar2;
            *(undefined8 *)(pBVar1 + 8) = uVar7;
            puVar2 = (undefined8 *)((long)src + lVar10 + 0x30);
            uVar7 = puVar2[1];
            *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
            *(undefined8 *)(pBVar1 + 0x18) = uVar7;
            lVar10 = lVar10 + 0x20;
          } while (pBVar1 + 0x20 < pBVar5 + uVar15);
        }
        goto LAB_001c5e3e;
      }
      seqStore->lit = pBVar5 + uVar15;
    }
    psVar6 = seqStore->sequences;
    psVar6->litLength = (U16)uVar15;
    psVar6->offBase = (U32)sVar9;
    if (local_70 < 3) {
LAB_001c62e5:
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,700,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0xffff < local_70 - 3) {
      if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_001c6342:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2bf,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar6 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar6->mlBase = (U16)(local_70 - 3);
    seqStore->sequences = psVar6 + 1;
    if (ms_00->lazySkipping != 0) {
      uVar14 = ms_00->nextToUpdate;
      uVar16 = (ulong)uVar14;
      UVar3 = ms_00->rowHashLog;
      uVar13 = ((int)local_68 - (int)(local_a8 + uVar16)) + 1;
      if (7 < uVar13) {
        uVar13 = 8;
      }
      if (local_68 < local_a8 + uVar16) {
        uVar13 = 0;
      }
      pUVar4 = ms_00->hashTable;
      pBVar5 = ms_00->tagTable;
      local_90 = CONCAT44(local_90._4_4_,UVar3 + 8);
      local_88 = (ulong)(0x38 - UVar3);
      local_98 = 0x18 - UVar3;
      local_9c = uVar8;
      local_78 = iend;
      for (; uVar16 < uVar13 + uVar14; uVar16 = uVar16 + 1) {
        if (0x20 < (uint)local_90) goto LAB_001c624a;
        if (uVar12 == 5) {
          uVar15 = *(long *)(local_a8 + uVar16) * -0x30e4432345000000;
LAB_001c601e:
          uVar15 = (uVar15 ^ ms_00->hashSalt) >> ((byte)local_88 & 0x3f);
        }
        else {
          if (uVar12 == 6) {
            uVar15 = *(long *)(local_a8 + uVar16) * -0x30e4432340650000;
            goto LAB_001c601e;
          }
          uVar15 = (ulong)((*(int *)(local_a8 + uVar16) * -0x61c8864f ^ (uint)ms_00->hashSalt) >>
                          ((byte)local_98 & 0x1f));
        }
        uVar8 = ((uint)(uVar15 >> 8) & 0xffffff) << ((byte)local_94 & 0x1f);
        if (((ulong)(pUVar4 + uVar8) & 0x3f) != 0) goto LAB_001c6269;
        iVar11 = ZSTD_isAligned(pBVar5 + uVar8,local_48);
        if (iVar11 == 0) goto LAB_001c6288;
        local_50->hashCache[(uint)uVar16 & 7] = (U32)uVar15;
        ms_00 = local_50;
      }
      ms_00->lazySkipping = 0;
      iend = local_78;
      uVar8 = local_9c;
    }
    for (src = (void *)((long)iend + local_70);
        ((uVar14 = uVar8, ip = (int *)src, local_bc != 0 && (src <= local_68)) &&
        (*src == *(int *)((long)src - (ulong)local_bc))); src = (void *)((long)src + sVar9 + 4)) {
      sVar9 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - (ulong)local_bc)),
                         (BYTE *)pInLimit);
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
      goto LAB_001c6323;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001c62a7;
      pBVar5 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar5) goto LAB_001c6304;
      if (pInLimit < src) goto LAB_001c62c6;
      if (local_80 < src) {
        ZSTD_safecopyLiterals(pBVar5,(BYTE *)src,(BYTE *)src,(BYTE *)local_80);
      }
      else {
        uVar7 = *(undefined8 *)((long)src + 8);
        *(undefined8 *)pBVar5 = *src;
        *(undefined8 *)(pBVar5 + 8) = uVar7;
      }
      psVar6 = seqStore->sequences;
      psVar6->litLength = 0;
      psVar6->offBase = 1;
      if (sVar9 + 4 < 3) goto LAB_001c62e5;
      if (0xffff < sVar9 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c6342;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos = (U32)((ulong)((long)psVar6 - (long)seqStore->sequencesStart) >> 3)
        ;
      }
      psVar6->mlBase = (U16)(sVar9 + 1);
      seqStore->sequences = psVar6 + 1;
      uVar8 = local_bc;
      local_bc = uVar14;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_greedy_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 0, ZSTD_noDict);
}